

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuidpp.cpp
# Opt level: O0

void cpuidpp::anon_unknown_138::ExtractChar<unsigned_int,_4UL,_4UL>::fill(uint value,string *out)

{
  char ch;
  size_t Index;
  string *out_local;
  uint value_local;
  
  ExtractChar<unsigned_int,_3UL,_4UL>::fill(value,out);
  std::__cxx11::string::append((ulong)out,'\x01');
  return;
}

Assistant:

static void fill(T value, std::string& out)
    {
        constexpr std::size_t Index = N - 1;

        ExtractChar<T, N - 1, Size>::fill(value, out);

        const auto ch = static_cast<char>((value >> (Index * 8)) & 0xff);
        out.append(1, ch);
    }